

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::MessageOptions::InternalSwap(MessageOptions *this,MessageOptions *other)

{
  InternalMetadataWithArena *this_00;
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  void *pvVar4;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar5;
  UnknownFieldSet *pUVar6;
  UnknownFieldSet *pUVar7;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
  bVar1 = this->message_set_wire_format_;
  this->message_set_wire_format_ = other->message_set_wire_format_;
  other->message_set_wire_format_ = bVar1;
  bVar1 = this->no_standard_descriptor_accessor_;
  this->no_standard_descriptor_accessor_ = other->no_standard_descriptor_accessor_;
  other->no_standard_descriptor_accessor_ = bVar1;
  bVar1 = this->deprecated_;
  this->deprecated_ = other->deprecated_;
  other->deprecated_ = bVar1;
  bVar1 = this->map_entry_;
  this->map_entry_ = other->map_entry_;
  other->map_entry_ = bVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar4 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      pUVar7 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar7 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    pvVar4 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      pUVar6 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar6 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    pvVar5 = pUVar6->fields_;
    pUVar6->fields_ = pUVar7->fields_;
    pUVar7->fields_ = pvVar5;
  }
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  return;
}

Assistant:

void MessageOptions::InternalSwap(MessageOptions* other) {
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
  std::swap(message_set_wire_format_, other->message_set_wire_format_);
  std::swap(no_standard_descriptor_accessor_, other->no_standard_descriptor_accessor_);
  std::swap(deprecated_, other->deprecated_);
  std::swap(map_entry_, other->map_entry_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
  _extensions_.Swap(&other->_extensions_);
}